

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O1

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerType
          (DiagnosticsReporter *this,SyntaxToken *tk)

{
  string local_68;
  SyntaxToken local_48;
  
  local_48.field_10 = tk->field_10;
  local_48.tree_._0_4_ = *(undefined4 *)&tk->tree_;
  local_48.tree_._4_4_ = *(undefined4 *)((long)&tk->tree_ + 4);
  local_48.syntaxK_ = tk->syntaxK_;
  local_48.byteSize_ = tk->byteSize_;
  local_48.charSize_ = tk->charSize_;
  local_48._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_48.byteOffset_ = tk->byteOffset_;
  local_48.charOffset_ = tk->charOffset_;
  local_48.matchingBracket_._0_4_ = (undefined4)tk->matchingBracket_;
  local_48.matchingBracket_._4_4_ = *(undefined4 *)((long)&tk->matchingBracket_ + 4);
  local_48.field_7 = tk->field_7;
  local_48._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_48.lineno_ = tk->lineno_;
  local_48.column_ = tk->column_;
  local_48._44_4_ = *(undefined4 *)&tk->field_0x2c;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"pointer","");
  ExpectedExpressionOfType_CORE
            (this,&local_48,&ID_of_ExpectedExpressionOfPointerType_abi_cxx11_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  SyntaxToken::~SyntaxToken(&local_48);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfPointerType(SyntaxToken tk)
{
    ExpectedExpressionOfType_CORE(
                tk,
                ID_of_ExpectedExpressionOfPointerType,
                "pointer");
}